

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O1

shared_ptr<mocker::ir::IRInst> __thiscall
mocker::ir::copyWithReplacedDest
          (ir *this,shared_ptr<mocker::ir::IRInst> *inst,shared_ptr<mocker::ir::Reg> *newDest)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  pointer psVar3;
  pointer ppVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  shared_ptr<mocker::ir::Addr> *arg;
  pointer __args;
  element_type *peVar8;
  ulong uVar9;
  shared_ptr<mocker::ir::IRInst> sVar10;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  args;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  options;
  value_type val;
  shared_ptr<mocker::ir::Label> label;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_90;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr<mocker::ir::Addr> local_58;
  shared_ptr<mocker::ir::Label> local_48;
  
  getOperandsUsed(&local_90,inst);
  peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar8->type == Deleted) {
    p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
    }
  }
  else {
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar8 = (element_type *)0x0;
  }
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (peVar8 == (element_type *)0x0) {
    peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar8->type == Comment) {
      p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
    }
    else {
      peVar8 = (element_type *)0x0;
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    if (peVar8 != (element_type *)0x0) {
      if (local_90.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_90.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("operands.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                      ,0x51,
                      "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                     );
      }
      local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<mocker::ir::Comment,std::allocator<mocker::ir::Comment>,std::__cxx11::string_const&>
                (&local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Comment **)&local_b8,(allocator<mocker::ir::Comment> *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar8 + 1));
      _Var2._M_pi = local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      *(element_type **)this =
           local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined8 *)(this + 8) = 0;
      local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    if (peVar8 == (element_type *)0x0) {
      peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar8->type == AttachedComment) {
        p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
      }
      else {
        peVar8 = (element_type *)0x0;
        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if (peVar8 != (element_type *)0x0) {
        if (local_90.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_90.
            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __assert_fail("operands.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                        ,0x55,
                        "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                       );
        }
        local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<mocker::ir::AttachedComment,std::allocator<mocker::ir::AttachedComment>,std::__cxx11::string_const&>
                  (&local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(AttachedComment **)&local_b8,
                   (allocator<mocker::ir::AttachedComment> *)&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(peVar8 + 1)
                  );
        _Var2._M_pi = local_b8.first.
                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
        *(element_type **)this =
             local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        *(undefined8 *)(this + 8) = 0;
        local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (peVar8 == (element_type *)0x0) {
        peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar8->type == Alloca) {
          p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            }
          }
        }
        else {
          peVar8 = (element_type *)0x0;
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if (peVar8 != (element_type *)0x0) {
          if (local_90.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_90.
              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            __assert_fail("operands.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                          ,0x59,
                          "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                         );
          }
          local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>const&>
                    (&local_b8.first.
                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (Alloca **)&local_b8,(allocator<mocker::ir::Alloca> *)&local_78,newDest);
          _Var2._M_pi = local_b8.first.
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi;
          *(element_type **)this =
               local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          *(undefined8 *)(this + 8) = 0;
          local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
        }
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
        }
        if (peVar8 == (element_type *)0x0) {
          peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          if (peVar8->type == Jump) {
            p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
              }
            }
          }
          else {
            peVar8 = (element_type *)0x0;
            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          if (peVar8 != (element_type *)0x0) {
            if (local_90.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_90.
                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              __assert_fail("operands.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                            ,0x5d,
                            "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                           );
            }
            local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>const&>
                      (&local_b8.first.
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ,(Jump **)&local_b8,(allocator<mocker::ir::Jump> *)&local_78,
                       (shared_ptr<mocker::ir::Label> *)&peVar8[1].type);
            _Var2._M_pi = local_b8.first.
                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            *(element_type **)this =
                 local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            *(undefined8 *)(this + 8) = 0;
            local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
          }
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if (peVar8 == (element_type *)0x0) {
            peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            if (peVar8->type == Assign) {
              p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                }
              }
            }
            else {
              peVar8 = (element_type *)0x0;
              p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if (peVar8 != (element_type *)0x0) {
              if ((long)local_90.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_90.
                        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                __assert_fail("operands.size() == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                              ,0x62,
                              "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                             );
              }
              local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)0x0;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<mocker::ir::Assign,std::allocator<mocker::ir::Assign>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
                        (&local_b8.first.
                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,(Assign **)&local_b8,
                         (allocator<mocker::ir::Assign> *)&local_78,newDest,
                         local_90.
                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              _Var2._M_pi = local_b8.first.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              *(element_type **)this =
                   local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              *(undefined8 *)(this + 8) = 0;
              local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
            }
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            if (peVar8 == (element_type *)0x0) {
              peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
              if (peVar8->type == ArithUnaryInst) {
                p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                  }
                }
              }
              else {
                peVar8 = (element_type *)0x0;
                p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              }
              if (peVar8 != (element_type *)0x0) {
                if ((long)local_90.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_90.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                  __assert_fail("operands.size() == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                ,0x66,
                                "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                               );
                }
                local_78.
                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_78.
                                       super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       peVar8[2].type);
                local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<mocker::ir::ArithUnaryInst,std::allocator<mocker::ir::ArithUnaryInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithUnaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&>
                          (&local_b8.first.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,(ArithUnaryInst **)&local_b8,
                           (allocator<mocker::ir::ArithUnaryInst> *)&local_58,newDest,
                           (OpType *)&local_78,
                           local_90.
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                _Var2._M_pi = local_b8.first.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                *(element_type **)this =
                     local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                *(undefined8 *)(this + 8) = 0;
                local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
              }
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              if (peVar8 == (element_type *)0x0) {
                peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                if (peVar8->type == ArithBinaryInst) {
                  p_Var7 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                           )._M_refcount._M_pi;
                  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                    }
                  }
                }
                else {
                  peVar8 = (element_type *)0x0;
                  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                }
                if (peVar8 != (element_type *)0x0) {
                  if ((long)local_90.
                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_90.
                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                    __assert_fail("operands.size() == 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                  ,0x6a,
                                  "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                 );
                  }
                  local_78.
                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(local_78.
                                         super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         peVar8[2].type);
                  local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::ir::ArithBinaryInst,std::allocator<mocker::ir::ArithBinaryInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
                            (&local_b8.first.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(ArithBinaryInst **)&local_b8,
                             (allocator<mocker::ir::ArithBinaryInst> *)&local_58,newDest,
                             (OpType *)&local_78,
                             local_90.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_90.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
                  _Var2._M_pi = local_b8.first.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                  *(element_type **)this =
                       local_b8.first.
                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  *(undefined8 *)(this + 8) = 0;
                  local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
                }
                if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                }
                if (peVar8 == (element_type *)0x0) {
                  peVar8 = (inst->super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr;
                  if (peVar8->type == RelationInst) {
                    p_Var7 = (inst->
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                             _M_refcount._M_pi;
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                      }
                    }
                  }
                  else {
                    peVar8 = (element_type *)0x0;
                    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  }
                  if (peVar8 != (element_type *)0x0) {
                    if ((long)local_90.
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_90.
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                      __assert_fail("operands.size() == 2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                    ,0x6e,
                                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                   );
                    }
                    local_78.
                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)CONCAT44(local_78.
                                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           peVar8[2].type);
                    local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::ir::RelationInst,std::allocator<mocker::ir::RelationInst>,std::shared_ptr<mocker::ir::Reg>const&,mocker::ir::RelationInst::OpType,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
                              (&local_b8.first.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount,(RelationInst **)&local_b8,
                               (allocator<mocker::ir::RelationInst> *)&local_58,newDest,
                               (OpType *)&local_78,
                               local_90.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_90.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1);
                    _Var2._M_pi = local_b8.first.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                    *(element_type **)this =
                         local_b8.first.
                         super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                    *(undefined8 *)(this + 8) = 0;
                    local_b8.first.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
                  }
                  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                  }
                  if (peVar8 == (element_type *)0x0) {
                    peVar8 = (inst->
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    if (peVar8->type == Store) {
                      p_Var7 = (inst->
                               super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                               _M_refcount._M_pi;
                      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                        }
                      }
                    }
                    else {
                      peVar8 = (element_type *)0x0;
                      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    }
                    if (peVar8 != (element_type *)0x0) {
                      if ((long)local_90.
                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_90.
                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                        __assert_fail("operands.size() == 2",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                      ,0x72,
                                      "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                     );
                      }
                      local_b8.first.
                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)0x0;
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                      __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Addr>const&>
                                (&local_b8.first.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(Store **)&local_b8,
                                 (allocator<mocker::ir::Store> *)&local_78,
                                 local_90.
                                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 local_90.
                                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1);
                      _Var2._M_pi = local_b8.first.
                                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
                      *(element_type **)this =
                           local_b8.first.
                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                      *(undefined8 *)(this + 8) = 0;
                      local_b8.first.
                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
                    }
                    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                    }
                    if (peVar8 == (element_type *)0x0) {
                      peVar8 = (inst->
                               super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr;
                      if (peVar8->type == Load) {
                        p_Var7 = (inst->
                                 super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_refcount._M_pi;
                        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                          }
                        }
                      }
                      else {
                        peVar8 = (element_type *)0x0;
                        p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      }
                      if (peVar8 != (element_type *)0x0) {
                        if ((long)local_90.
                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_90.
                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                          __assert_fail("operands.size() == 1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                        ,0x76,
                                        "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                       );
                        }
                        local_b8.first.
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)0x0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
                                  (&local_b8.first.
                                    super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(Load **)&local_b8,
                                   (allocator<mocker::ir::Load> *)&local_78,newDest,
                                   local_90.
                                   super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                        _Var2._M_pi = local_b8.first.
                                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi;
                        *(element_type **)this =
                             local_b8.first.
                             super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ;
                        *(undefined8 *)(this + 8) = 0;
                        local_b8.first.
                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
                      }
                      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                      }
                      if (peVar8 == (element_type *)0x0) {
                        peVar8 = (inst->
                                 super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr;
                        if (peVar8->type == Malloc) {
                          p_Var7 = (inst->
                                   super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                            }
                          }
                        }
                        else {
                          peVar8 = (element_type *)0x0;
                          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                        }
                        if (peVar8 != (element_type *)0x0) {
                          if ((long)local_90.
                                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_90.
                                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                            __assert_fail("operands.size() == 1",
                                          "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                          ,0x7a,
                                          "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                         );
                          }
                          local_b8.first.
                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                               (element_type *)0x0;
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                          __shared_count<mocker::ir::Malloc,std::allocator<mocker::ir::Malloc>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Addr>const&>
                                    (&local_b8.first.
                                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(Malloc **)&local_b8,
                                     (allocator<mocker::ir::Malloc> *)&local_78,newDest,
                                     local_90.
                                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                          _Var2._M_pi = local_b8.first.
                                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi;
                          *(element_type **)this =
                               local_b8.first.
                               super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr;
                          *(undefined8 *)(this + 8) = 0;
                          local_b8.first.
                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi
                          ;
                        }
                        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                        }
                        if (peVar8 == (element_type *)0x0) {
                          peVar8 = (inst->
                                   super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                          if (peVar8->type == Branch) {
                            p_Var7 = (inst->
                                     super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi;
                            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              if (__libc_single_threaded == '\0') {
                                LOCK();
                                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                                UNLOCK();
                              }
                              else {
                                p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                              }
                            }
                          }
                          else {
                            peVar8 = (element_type *)0x0;
                            p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                          }
                          if (peVar8 != (element_type *)0x0) {
                            if ((long)local_90.
                                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_90.
                                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start != 0x10) {
                              __assert_fail("operands.size() == 1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                            ,0x7e,
                                            "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                           );
                            }
                            local_b8.first.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                 = (element_type *)0x0;
                            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                            __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>const&,std::shared_ptr<mocker::ir::Label>const&>
                                      (&local_b8.first.
                                        super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,(Branch **)&local_b8,
                                       (allocator<mocker::ir::Branch> *)&local_78,
                                       local_90.
                                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,
                                       (shared_ptr<mocker::ir::Label> *)&peVar8[2].type,
                                       (shared_ptr<mocker::ir::Label> *)&peVar8[3].type);
                            _Var2._M_pi = local_b8.first.
                                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi;
                            *(element_type **)this =
                                 local_b8.first.
                                 super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                            *(undefined8 *)(this + 8) = 0;
                            local_b8.first.
                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
                                 _Var2._M_pi;
                          }
                          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                          }
                          if (peVar8 == (element_type *)0x0) {
                            peVar8 = (inst->
                                     super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr;
                            if (peVar8->type == Ret) {
                              p_Var7 = (inst->
                                       super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_refcount._M_pi;
                              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if (__libc_single_threaded == '\0') {
                                  LOCK();
                                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                                  UNLOCK();
                                }
                                else {
                                  p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
                                }
                              }
                            }
                            else {
                              peVar8 = (element_type *)0x0;
                              p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                            }
                            if (peVar8 != (element_type *)0x0) {
                              if (0x10 < (ulong)((long)local_90.
                                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)local_90.
                                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)) {
                                __assert_fail("operands.size() <= 1",
                                              "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                              ,0x82,
                                              "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                             );
                              }
                              if (local_90.
                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start ==
                                  local_90.
                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish) {
                                local_78.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_78.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                              }
                              else {
                                local_78.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start =
                                     (pointer)((local_90.
                                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr;
                                local_78.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish =
                                     (pointer)((local_90.
                                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_refcount._M_pi;
                                if (local_78.
                                    super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    p_Var1 = &((local_78.
                                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->first).
                                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount;
                                    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    p_Var1 = &((local_78.
                                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->first).
                                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount;
                                    *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
                                  }
                                }
                              }
                              local_b8.first.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (element_type *)0x0;
                              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                              __shared_count<mocker::ir::Ret,std::allocator<mocker::ir::Ret>,std::shared_ptr<mocker::ir::Addr>const>
                                        (&local_b8.first.
                                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,(Ret **)&local_b8,
                                         (allocator<mocker::ir::Ret> *)&local_58,
                                         (shared_ptr<mocker::ir::Addr> *)&local_78);
                              _Var2._M_pi = local_b8.first.
                                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi;
                              *(element_type **)this =
                                   local_b8.first.
                                   super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr;
                              *(undefined8 *)(this + 8) = 0;
                              local_b8.first.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
                                   _Var2._M_pi;
                              local_b8.first.
                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr = (element_type *)0x0;
                              if (local_78.
                                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                           local_78.
                                           super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                              }
                            }
                            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                            }
                            if (peVar8 == (element_type *)0x0) {
                              local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                         (inst->
                                         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr;
                              if (local_98->_M_use_count == Call) {
                                local_60 = (inst->
                                           super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_refcount._M_pi;
                                if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
                                  if (__libc_single_threaded == '\0') {
                                    LOCK();
                                    local_60->_M_use_count = local_60->_M_use_count + 1;
                                    UNLOCK();
                                  }
                                  else {
                                    local_60->_M_use_count = local_60->_M_use_count + 1;
                                  }
                                }
                              }
                              else {
                                local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                              }
                              if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                if ((long)local_90.
                                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_90.
                                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start !=
                                    (long)local_98[5]._vptr__Sp_counted_base -
                                    *(long *)&local_98[4]._M_use_count) {
                                  __assert_fail("operands.size() == p->getArgs().size()",
                                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                                ,0x87,
                                                "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                               );
                                }
                                local_b8.first.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (element_type *)0x0;
                                local_b8.first.
                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi =
                                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                local_b8.second.
                                super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr = (element_type *)0x0;
                                std::
                                vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                ::reserve((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                           *)&local_b8,
                                          (long)local_90.
                                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_90.
                                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 4);
                                psVar3 = local_90.
                                         super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                                if (local_90.
                                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start !=
                                    local_90.
                                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish) {
                                  __args = local_90.
                                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  do {
                                    std::
                                    vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>
                                    ::emplace_back<std::shared_ptr<mocker::ir::Addr>const&>
                                              ((vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>
                                                *)&local_b8,__args);
                                    __args = __args + 1;
                                  } while (__args != psVar3);
                                }
                                local_78.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                __shared_count<mocker::ir::Call,std::allocator<mocker::ir::Call>,std::shared_ptr<mocker::ir::Reg>const&,std::__cxx11::string_const&,std::vector<std::shared_ptr<mocker::ir::Addr>,std::allocator<std::shared_ptr<mocker::ir::Addr>>>>
                                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                           &local_78.
                                            super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish,
                                           (Call **)&local_78,
                                           (allocator<mocker::ir::Call> *)&local_58,newDest,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_98[2]._M_use_count,
                                           (vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                            *)&local_b8);
                                ppVar4 = local_78.
                                         super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                                *(pointer *)this =
                                     local_78.
                                     super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                *(undefined8 *)(this + 8) = 0;
                                local_78.
                                super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                *(pointer *)(this + 8) = ppVar4;
                                std::
                                vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                ::~vector((vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                           *)&local_b8);
                              }
                              if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                          (local_60);
                              }
                              if (local_98 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                peVar8 = (inst->
                                         super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr;
                                if (peVar8->type == Phi) {
                                  local_98 = (inst->
                                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                                             )._M_refcount._M_pi;
                                  if (local_98 !=
                                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                    if (__libc_single_threaded == '\0') {
                                      LOCK();
                                      local_98->_M_use_count = local_98->_M_use_count + 1;
                                      UNLOCK();
                                    }
                                    else {
                                      local_98->_M_use_count = local_98->_M_use_count + 1;
                                    }
                                  }
                                }
                                else {
                                  peVar8 = (element_type *)0x0;
                                  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                }
                                if (peVar8 != (element_type *)0x0) {
                                  if ((long)local_90.
                                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_90.
                                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4 !=
                                      (long)peVar8[3]._vptr_IRInst - *(long *)&peVar8[2].type >> 5)
                                  {
                                    __assert_fail("operands.size() == p->getOptions().size()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                                  ,0x8f,
                                                  "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                                 );
                                  }
                                  local_78.
                                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_78.
                                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_78.
                                  super__Vector_base<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if (local_90.
                                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish !=
                                      local_90.
                                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) {
                                    lVar6 = 0;
                                    uVar9 = 0;
                                    do {
                                      local_58.
                                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = *(element_type **)
                                                 ((long)&((local_90.
                                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar6);
                                      local_58.
                                      super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi =
                                           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                            ((long)&((local_90.
                                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_refcount._M_pi + lVar6);
                                      if (local_58.
                                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        if (__libc_single_threaded == '\0') {
                                          LOCK();
                                          (local_58.
                                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_58.
                                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                          UNLOCK();
                                        }
                                        else {
                                          (local_58.
                                           super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi)->_M_use_count =
                                               (local_58.
                                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_M_use_count + 1;
                                        }
                                      }
                                      local_48.
                                      super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr = *(element_type **)
                                                 (*(long *)&peVar8[2].type + 0x10 + lVar6 * 2);
                                      if (local_48.
                                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr == (element_type *)0x0) {
                                        local_48.
                                        super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr = (element_type *)0x0;
                                        local_48.
                                        super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi =
                                             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                      }
                                      else {
                                        local_48.
                                        super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi =
                                             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                              (*(long *)&peVar8[2].type + 0x18 + lVar6 * 2);
                                        if (local_48.
                                            super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi !=
                                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                          if (__libc_single_threaded == '\0') {
                                            LOCK();
                                            (local_48.
                                             super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_M_use_count =
                                                 (local_48.
                                                  super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                            UNLOCK();
                                          }
                                          else {
                                            (local_48.
                                             super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi)->_M_use_count =
                                                 (local_48.
                                                  super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi)->_M_use_count + 1;
                                          }
                                        }
                                      }
                                      std::
                                      pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                                      ::
                                      pair<std::shared_ptr<mocker::ir::Addr>_&,_std::shared_ptr<mocker::ir::Label>_&,_true>
                                                (&local_b8,&local_58,&local_48);
                                      std::
                                      vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                                      ::
                                      emplace_back<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>
                                                ((vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>
                                                  *)&local_78,&local_b8);
                                      std::
                                      pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>
                                      ::~pair(&local_b8);
                                      if (local_48.
                                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_48.
                                                  super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      if (local_58.
                                          super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi !=
                                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::
                                        _M_release(local_58.
                                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
                                      }
                                      uVar9 = uVar9 + 1;
                                      lVar6 = lVar6 + 0x10;
                                    } while (uVar9 < (ulong)((long)local_90.
                                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_90.
                                                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4));
                                  }
                                  local_b8.first.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr = (element_type *)0x0;
                                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                                  __shared_count<mocker::ir::Phi,std::allocator<mocker::ir::Phi>,std::shared_ptr<mocker::ir::Reg>const&,std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>,std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>>>>>
                                            (&local_b8.first.
                                              super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount,(Phi **)&local_b8,
                                             (allocator<mocker::ir::Phi> *)&local_58,newDest,
                                             &local_78);
                                  _Var2._M_pi = local_b8.first.
                                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi;
                                  *(element_type **)this =
                                       local_b8.first.
                                       super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                                  *(undefined8 *)(this + 8) = 0;
                                  local_b8.first.
                                  super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi =
                                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
                                       _Var2._M_pi;
                                  std::
                                  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                                  ::~vector(&local_78);
                                }
                                if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
                                {
                                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                            (local_98);
                                }
                                if (peVar8 == (element_type *)0x0) {
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                                                ,0x98,
                                                "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                                               );
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    if (local_90.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_90.
        super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("operands.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/helper.cpp"
                    ,0x4d,
                    "std::shared_ptr<IRInst> mocker::ir::(anonymous namespace)::copyWithReplacedDestAndOperands(const std::shared_ptr<ir::IRInst> &, const std::shared_ptr<ir::Reg> &, const std::vector<std::shared_ptr<ir::Addr>> &)"
                   );
    }
    puVar5 = (undefined8 *)operator_new(0x20);
    puVar5[1] = 0x100000001;
    *puVar5 = &PTR___Sp_counted_ptr_inplace_001efd18;
    *(undefined4 *)(puVar5 + 3) = 0;
    puVar5[2] = &PTR__IRInst_001efd68;
    *(undefined8 **)this = puVar5 + 2;
    *(undefined8 **)(this + 8) = puVar5;
  }
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  ~vector(&local_90);
  sVar10.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar10.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::IRInst>)
         sVar10.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IRInst>
copyWithReplacedDest(const std::shared_ptr<ir::IRInst> &inst,
                     const std::shared_ptr<ir::Reg> &newDest) {
  return copyWithReplacedDestAndOperands(inst, newDest, getOperandsUsed(inst));
}